

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O1

void xmlSnprintfElementContent(char *buf,int size,xmlElementContentPtr content,int englob)

{
  xmlElementContentOccur xVar1;
  int iVar2;
  int iVar3;
  xmlElementContentType xVar4;
  size_t sVar5;
  _xmlElementContent *content_00;
  int iVar6;
  
  if (content == (xmlElementContentPtr)0x0) {
    return;
  }
  sVar5 = strlen(buf);
  iVar2 = (int)sVar5;
  iVar6 = size - iVar2;
  if (iVar6 < 0x32) {
joined_r0x0018e854:
    if (iVar6 < 5) {
      return;
    }
    if (buf[iVar2 + -1] == '.') {
      return;
    }
    sVar5 = strlen(buf);
    builtin_strncpy(buf + sVar5," ...",5);
    return;
  }
  if (englob != 0) {
    sVar5 = strlen(buf);
    (buf + sVar5)[0] = '(';
    (buf + sVar5)[1] = '\0';
  }
  switch(content->type) {
  case XML_ELEMENT_CONTENT_PCDATA:
    sVar5 = strlen(buf);
    builtin_strncpy(buf + sVar5,"#PCDATA",8);
    break;
  case XML_ELEMENT_CONTENT_ELEMENT:
    iVar2 = xmlStrlen(content->name);
    if (content->prefix != (xmlChar *)0x0) {
      iVar3 = xmlStrlen(content->prefix);
      iVar2 = iVar2 + iVar3 + 1;
    }
    if (iVar6 < iVar2 + 10) {
      sVar5 = strlen(buf);
      builtin_strncpy(buf + sVar5," ...",5);
    }
    else {
      if (content->prefix != (xmlChar *)0x0) {
        strcat(buf,(char *)content->prefix);
        sVar5 = strlen(buf);
        (buf + sVar5)[0] = ':';
        (buf + sVar5)[1] = '\0';
      }
      if (content->name != (xmlChar *)0x0) {
        strcat(buf,(char *)content->name);
      }
    }
    if (iVar6 < iVar2 + 10) {
      return;
    }
    break;
  case XML_ELEMENT_CONTENT_SEQ:
    xmlSnprintfElementContent
              (buf,size,content->c1,(uint)(content->c1->type - XML_ELEMENT_CONTENT_SEQ < 2));
    sVar5 = strlen(buf);
    iVar2 = (int)sVar5;
    iVar6 = size - iVar2;
    if (iVar6 < 0x32) goto joined_r0x0018e854;
    sVar5 = strlen(buf);
    builtin_strncpy(buf + sVar5," , ",4);
    content_00 = content->c2;
    xVar4 = content_00->type;
    if (xVar4 == XML_ELEMENT_CONTENT_OR) {
LAB_0018e8c3:
      iVar2 = 1;
    }
    else {
LAB_0018e8b8:
      if ((xVar4 != XML_ELEMENT_CONTENT_ELEMENT) && (content_00->ocur != XML_ELEMENT_CONTENT_ONCE))
      goto LAB_0018e8c3;
      iVar2 = 0;
    }
    xmlSnprintfElementContent(buf,size,content_00,iVar2);
    break;
  case XML_ELEMENT_CONTENT_OR:
    xmlSnprintfElementContent
              (buf,size,content->c1,(uint)(content->c1->type - XML_ELEMENT_CONTENT_SEQ < 2));
    sVar5 = strlen(buf);
    iVar2 = (int)sVar5;
    iVar6 = size - iVar2;
    if (iVar6 < 0x32) goto joined_r0x0018e854;
    sVar5 = strlen(buf);
    builtin_strncpy(buf + sVar5," | ",4);
    content_00 = content->c2;
    xVar4 = content_00->type;
    if (xVar4 != XML_ELEMENT_CONTENT_SEQ) goto LAB_0018e8b8;
    goto LAB_0018e8c3;
  }
  sVar5 = strlen(buf);
  if (2 < (long)size - sVar5) {
    if (englob != 0) {
      sVar5 = strlen(buf);
      (buf + sVar5)[0] = ')';
      (buf + sVar5)[1] = '\0';
    }
    xVar1 = content->ocur;
    if (xVar1 == XML_ELEMENT_CONTENT_PLUS) {
      sVar5 = strlen(buf);
      (buf + sVar5)[0] = '+';
      (buf + sVar5)[1] = '\0';
    }
    else if (xVar1 == XML_ELEMENT_CONTENT_MULT) {
      sVar5 = strlen(buf);
      (buf + sVar5)[0] = '*';
      (buf + sVar5)[1] = '\0';
    }
    else if (xVar1 == XML_ELEMENT_CONTENT_OPT) {
      sVar5 = strlen(buf);
      (buf + sVar5)[0] = '?';
      (buf + sVar5)[1] = '\0';
    }
  }
  return;
}

Assistant:

void
xmlSnprintfElementContent(char *buf, int size, xmlElementContentPtr content, int englob) {
    int len;

    if (content == NULL) return;
    len = strlen(buf);
    if (size - len < 50) {
	if ((size - len > 4) && (buf[len - 1] != '.'))
	    strcat(buf, " ...");
	return;
    }
    if (englob) strcat(buf, "(");
    switch (content->type) {
        case XML_ELEMENT_CONTENT_PCDATA:
            strcat(buf, "#PCDATA");
	    break;
	case XML_ELEMENT_CONTENT_ELEMENT: {
            int qnameLen = xmlStrlen(content->name);

	    if (content->prefix != NULL)
                qnameLen += xmlStrlen(content->prefix) + 1;
	    if (size - len < qnameLen + 10) {
		strcat(buf, " ...");
		return;
	    }
	    if (content->prefix != NULL) {
		strcat(buf, (char *) content->prefix);
		strcat(buf, ":");
	    }
	    if (content->name != NULL)
		strcat(buf, (char *) content->name);
	    break;
        }
	case XML_ELEMENT_CONTENT_SEQ:
	    if ((content->c1->type == XML_ELEMENT_CONTENT_OR) ||
	        (content->c1->type == XML_ELEMENT_CONTENT_SEQ))
		xmlSnprintfElementContent(buf, size, content->c1, 1);
	    else
		xmlSnprintfElementContent(buf, size, content->c1, 0);
	    len = strlen(buf);
	    if (size - len < 50) {
		if ((size - len > 4) && (buf[len - 1] != '.'))
		    strcat(buf, " ...");
		return;
	    }
            strcat(buf, " , ");
	    if (((content->c2->type == XML_ELEMENT_CONTENT_OR) ||
		 (content->c2->ocur != XML_ELEMENT_CONTENT_ONCE)) &&
		(content->c2->type != XML_ELEMENT_CONTENT_ELEMENT))
		xmlSnprintfElementContent(buf, size, content->c2, 1);
	    else
		xmlSnprintfElementContent(buf, size, content->c2, 0);
	    break;
	case XML_ELEMENT_CONTENT_OR:
	    if ((content->c1->type == XML_ELEMENT_CONTENT_OR) ||
	        (content->c1->type == XML_ELEMENT_CONTENT_SEQ))
		xmlSnprintfElementContent(buf, size, content->c1, 1);
	    else
		xmlSnprintfElementContent(buf, size, content->c1, 0);
	    len = strlen(buf);
	    if (size - len < 50) {
		if ((size - len > 4) && (buf[len - 1] != '.'))
		    strcat(buf, " ...");
		return;
	    }
            strcat(buf, " | ");
	    if (((content->c2->type == XML_ELEMENT_CONTENT_SEQ) ||
		 (content->c2->ocur != XML_ELEMENT_CONTENT_ONCE)) &&
		(content->c2->type != XML_ELEMENT_CONTENT_ELEMENT))
		xmlSnprintfElementContent(buf, size, content->c2, 1);
	    else
		xmlSnprintfElementContent(buf, size, content->c2, 0);
	    break;
    }
    if (size - strlen(buf) <= 2) return;
    if (englob)
        strcat(buf, ")");
    switch (content->ocur) {
        case XML_ELEMENT_CONTENT_ONCE:
	    break;
        case XML_ELEMENT_CONTENT_OPT:
	    strcat(buf, "?");
	    break;
        case XML_ELEMENT_CONTENT_MULT:
	    strcat(buf, "*");
	    break;
        case XML_ELEMENT_CONTENT_PLUS:
	    strcat(buf, "+");
	    break;
    }
}